

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLAssetLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::AssetLoader15::data__up_axis(AssetLoader15 *this,ENUM__up_axis_enum value)

{
  byte bVar1;
  undefined4 in_ESI;
  long in_RDI;
  ENUM__UpAxisType val;
  undefined4 local_10;
  
  switch(in_ESI) {
  case 0:
    local_10 = 0;
    break;
  case 1:
    local_10 = 1;
    break;
  case 2:
    local_10 = 2;
    break;
  case 3:
    local_10 = 3;
    break;
  case 4:
    local_10 = 4;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x18) + 0x1b0))(*(long **)(in_RDI + 0x18),local_10);
  return (bool)(bVar1 & 1);
}

Assistant:

bool AssetLoader15::data__up_axis( const COLLADASaxFWL15::ENUM__up_axis_enum value )
{
SaxVirtualFunctionTest15(data__up_axis(value));
COLLADASaxFWL::ENUM__UpAxisType val;
switch (value) {
case COLLADASaxFWL15::ENUM__up_axis_enum__X_UP: val=COLLADASaxFWL::ENUM__UpAxisType__X_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__Y_UP: val=COLLADASaxFWL::ENUM__UpAxisType__Y_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__Z_UP: val=COLLADASaxFWL::ENUM__UpAxisType__Z_UP; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__COUNT: val=COLLADASaxFWL::ENUM__UpAxisType__INVALID; break;
case COLLADASaxFWL15::ENUM__up_axis_enum__NOT_PRESENT: val=COLLADASaxFWL::ENUM__UpAxisType__NOT_PRESENT; break;
}
return mLoader->data__up_axis(val);
}